

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3ValueText(sqlite3_value *pVal,u8 enc)

{
  ushort uVar1;
  int iVar2;
  
  if (pVal == (sqlite3_value *)0x0) {
    return (void *)0x0;
  }
  uVar1 = pVal->flags;
  if ((uVar1 & 1) == 0) {
    pVal->flags = uVar1 >> 3 & 2 | uVar1;
    if ((uVar1 >> 0xe & 1) != 0) {
      sqlite3VdbeMemExpandBlob(pVal);
    }
    if ((pVal->flags & 2) == 0) {
      sqlite3VdbeMemStringify(pVal,(uint)enc);
    }
    else {
      sqlite3VdbeChangeEncoding(pVal,enc & 0xfffffff7);
      if ((((enc & 8) != 0) && (((ulong)pVal->z & 1) != 0)) &&
         (iVar2 = sqlite3VdbeMemMakeWriteable(pVal), iVar2 != 0)) {
        return (void *)0x0;
      }
      sqlite3VdbeMemNulTerminate(pVal);
    }
    if (pVal->enc == (enc & 0xf7)) {
      return pVal->z;
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE const void *sqlite3ValueText(sqlite3_value* pVal, u8 enc){
  if( !pVal ) return 0;

  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( (pVal->flags & MEM_RowSet)==0 );

  if( pVal->flags&MEM_Null ){
    return 0;
  }
  assert( (MEM_Blob>>3) == MEM_Str );
  pVal->flags |= (pVal->flags & MEM_Blob)>>3;
  ExpandBlob(pVal);
  if( pVal->flags&MEM_Str ){
    sqlite3VdbeChangeEncoding(pVal, enc & ~SQLITE_UTF16_ALIGNED);
    if( (enc & SQLITE_UTF16_ALIGNED)!=0 && 1==(1&SQLITE_PTR_TO_INT(pVal->z)) ){
      assert( (pVal->flags & (MEM_Ephem|MEM_Static))!=0 );
      if( sqlite3VdbeMemMakeWriteable(pVal)!=SQLITE_OK ){
        return 0;
      }
    }
    sqlite3VdbeMemNulTerminate(pVal); /* IMP: R-31275-44060 */
  }else{
    assert( (pVal->flags&MEM_Blob)==0 );
    sqlite3VdbeMemStringify(pVal, enc);
    assert( 0==(1&SQLITE_PTR_TO_INT(pVal->z)) );
  }
  assert(pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) || pVal->db==0
              || pVal->db->mallocFailed );
  if( pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) ){
    return pVal->z;
  }else{
    return 0;
  }
}